

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjectAppearance.cpp
# Opt level: O2

void __thiscall
KDIS::DATA_TYPE::ObjectAppearance::Decode(ObjectAppearance *this,KDataStream *stream)

{
  KException *this_00;
  KUINT16 KVar1;
  allocator<char> local_41;
  KString local_40;
  
  KVar1 = KDataStream::GetBufferSize(stream);
  if (1 < KVar1) {
    KDataStream::Read(stream,(this->m_GeneralAppearanceUnion).m_ui8GeneralAppearance + 1);
    KDataStream::Read(stream,(KUOCTET *)&(this->m_GeneralAppearanceUnion).m_ui16GeneralAppearance);
    return;
  }
  this_00 = (KException *)__cxa_allocate_exception(0x30);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"Decode",&local_41);
  KException::KException(this_00,&local_40,2);
  __cxa_throw(this_00,&KException::typeinfo,KException::~KException);
}

Assistant:

void ObjectAppearance::Decode(KDataStream &stream) noexcept(false)
{
    if( stream.GetBufferSize() < OBJECT_APPEARANCE_SIZE )throw KException( __FUNCTION__, NOT_ENOUGH_DATA_IN_BUFFER );

    // Do not swap endian.
    stream >> m_GeneralAppearanceUnion.m_ui8GeneralAppearance[1]
           >> m_GeneralAppearanceUnion.m_ui8GeneralAppearance[0];
}